

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

string * __thiscall
ExpressionInternal::formatFunctionCall_abi_cxx11_
          (string *__return_storage_ptr__,ExpressionInternal *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer puVar1;
  ulong uVar2;
  string text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  __lhs = &valueAs<StringLiteral>(this)->_value;
  std::operator+(&local_70,__lhs,"(");
  for (uVar2 = 0;
      puVar1 = (this->children).
               super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->children).
                            super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar2 = uVar2 + 1) {
    if (uVar2 != 0) {
      std::__cxx11::string::append((char *)&local_70);
      puVar1 = (this->children).
               super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    toString_abi_cxx11_(&local_50,
                        (ExpressionInternal *)
                        puVar1[uVar2]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator+(__return_storage_ptr__,&local_70,")");
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionInternal::formatFunctionCall()
{
	std::string text = valueAs<StringLiteral>().string() + "(";

	for (size_t i = 0; i < children.size(); i++)
	{
		if (i != 0)
			text += ",";
		text += children[i]->toString();
	}

	return text + ")";
}